

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O0

int nk_widget_is_hovered(nk_context *ctx)

{
  undefined4 uVar1;
  undefined4 uVar2;
  nk_panel *pnVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  nk_rect rect;
  undefined1 local_48 [8];
  nk_rect bounds;
  nk_rect v;
  nk_rect c;
  nk_context *ctx_local;
  
  if (ctx == (nk_context *)0x0) {
    __assert_fail("ctx",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Rodousse[P]SSSGems/third_party/glfw/deps/nuklear.h"
                  ,0x499f,"int nk_widget_is_hovered(struct nk_context *)");
  }
  if (ctx->current != (nk_window *)0x0) {
    if (((ctx == (nk_context *)0x0) || (ctx->current == (nk_window *)0x0)) ||
       (ctx->active != ctx->current)) {
      ctx_local._4_4_ = 0;
    }
    else {
      pnVar3 = ctx->current->layout;
      uVar1 = (pnVar3->clip).x;
      uVar4 = (pnVar3->clip).y;
      uVar2 = (pnVar3->clip).w;
      uVar5 = (pnVar3->clip).h;
      v.w = (float)(int)(float)uVar1;
      v.h = (float)(int)(float)uVar4;
      nk_layout_peek((nk_rect *)local_48,ctx);
      nk_unify((nk_rect *)&bounds.w,(nk_rect *)&v.w,(float)local_48._0_4_,(float)local_48._4_4_,
               (float)local_48._0_4_ + bounds.x,(float)local_48._4_4_ + bounds.y);
      if (((v.w + (float)(int)(float)uVar2 < (float)local_48._0_4_) ||
          ((float)local_48._0_4_ + bounds.x < v.w)) ||
         ((v.h + (float)(int)(float)uVar5 < (float)local_48._4_4_ ||
          ((float)local_48._4_4_ + bounds.y < v.h)))) {
        ctx_local._4_4_ = 0;
      }
      else {
        rect.y = (float)local_48._4_4_;
        rect.x = (float)local_48._0_4_;
        rect.w = bounds.x;
        rect.h = bounds.y;
        ctx_local._4_4_ = nk_input_is_mouse_hovering_rect(&ctx->input,rect);
      }
    }
    return ctx_local._4_4_;
  }
  __assert_fail("ctx->current",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Rodousse[P]SSSGems/third_party/glfw/deps/nuklear.h"
                ,0x49a0,"int nk_widget_is_hovered(struct nk_context *)");
}

Assistant:

NK_API int
nk_widget_is_hovered(struct nk_context *ctx)
{
    struct nk_rect c, v;
    struct nk_rect bounds;
    NK_ASSERT(ctx);
    NK_ASSERT(ctx->current);
    if (!ctx || !ctx->current || ctx->active != ctx->current)
        return 0;

    c = ctx->current->layout->clip;
    c.x = (float)((int)c.x);
    c.y = (float)((int)c.y);
    c.w = (float)((int)c.w);
    c.h = (float)((int)c.h);

    nk_layout_peek(&bounds, ctx);
    nk_unify(&v, &c, bounds.x, bounds.y, bounds.x + bounds.w, bounds.y + bounds.h);
    if (!NK_INTERSECT(c.x, c.y, c.w, c.h, bounds.x, bounds.y, bounds.w, bounds.h))
        return 0;
    return nk_input_is_mouse_hovering_rect(&ctx->input, bounds);
}